

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void stbtt_GetScaledFontVMetrics
               (uchar *fontdata,int index,float size,float *ascent,float *descent,float *lineGap)

{
  ushort uVar1;
  ushort uVar2;
  int offset;
  long lVar3;
  uint uVar4;
  float fVar5;
  stbtt_fontinfo info;
  stbtt_fontinfo local_c0;
  
  offset = stbtt_GetFontOffsetForIndex(fontdata,index);
  stbtt_InitFont(&local_c0,fontdata,offset);
  if (size <= 0.0) {
    size = -size;
    uVar4 = (uint)(ushort)(*(ushort *)(local_c0.data + (long)local_c0.head + 0x12) << 8 |
                          *(ushort *)(local_c0.data + (long)local_c0.head + 0x12) >> 8);
  }
  else {
    lVar3 = (long)local_c0.hhea;
    uVar4 = ((int)(short)((ushort)local_c0.data[lVar3 + 4] << 8) | (uint)local_c0.data[lVar3 + 5]) -
            ((int)(short)((ushort)local_c0.data[lVar3 + 6] << 8) | (uint)local_c0.data[lVar3 + 7]);
  }
  fVar5 = size / (float)(int)uVar4;
  lVar3 = (long)local_c0.hhea;
  uVar1 = *(ushort *)(local_c0.data + lVar3 + 6);
  uVar2 = *(ushort *)(local_c0.data + lVar3 + 8);
  *ascent = (float)(int)(short)(*(ushort *)(local_c0.data + lVar3 + 4) << 8 |
                               *(ushort *)(local_c0.data + lVar3 + 4) >> 8) * fVar5;
  *descent = (float)(int)(short)(uVar1 << 8 | uVar1 >> 8) * fVar5;
  *lineGap = (float)(int)(short)(uVar2 << 8 | uVar2 >> 8) * fVar5;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetScaledFontVMetrics(const unsigned char *fontdata, int index, float size, float *ascent, float *descent, float *lineGap)
{
int i_ascent, i_descent, i_lineGap;
float scale;
stbtt_fontinfo info;
stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata, index));
scale = size > 0 ? stbtt_ScaleForPixelHeight(&info, size) : stbtt_ScaleForMappingEmToPixels(&info, -size);
stbtt_GetFontVMetrics(&info, &i_ascent, &i_descent, &i_lineGap);
*ascent  = (float) i_ascent  * scale;
*descent = (float) i_descent * scale;
*lineGap = (float) i_lineGap * scale;
}